

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_closed_list.hpp
# Opt level: O0

void __thiscall
compress::CompressClosedList<Node<Tiles>_>::CompressClosedList
          (CompressClosedList<Node<Tiles>_> *this,bool reopen_closed,bool enable_partitioning,
          bool double_hashing,size_t internal_closed_bytes)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  IOException *this_00;
  undefined8 uVar6;
  void *pvVar7;
  byte in_CL;
  byte in_DL;
  byte in_SIL;
  byte *in_RDI;
  ulong in_R8;
  TabulationHash<Node<Tiles>_> *in_stack_00000df0;
  unique_ptr<MappingTable,_std::default_delete<MappingTable>_> *in_stack_fffffffffffffe78;
  _IO_FILE *p_Var8;
  unique_ptr<MappingTable,_std::default_delete<MappingTable>_> *in_stack_fffffffffffffe80;
  unsigned_long *in_stack_fffffffffffffe98;
  vector<std::unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>,_std::allocator<std::unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>_>_>
  *in_stack_fffffffffffffea0;
  allocator *paVar9;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  IOException *in_stack_fffffffffffffec0;
  allocator local_c9;
  string local_c8 [38];
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [38];
  undefined1 local_7a;
  allocator local_79;
  string local_78 [38];
  undefined1 local_52;
  allocator local_51;
  string local_50 [56];
  ulong local_18;
  byte local_b;
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  local_b = in_CL & 1;
  *in_RDI = local_9;
  in_RDI[1] = local_a;
  in_RDI[2] = local_b;
  local_18 = in_R8;
  TabulationHash<Node<Tiles>_>::TabulationHash(in_stack_00000df0);
  TabulationHash<Node<Tiles>_>::TabulationHash(in_stack_00000df0);
  std::
  vector<std::unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>,_std::allocator<std::unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>_>_>
  ::vector((vector<std::unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>,_std::allocator<std::unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>_>_>
            *)0x10ce43);
  std::unique_ptr<MappingTable,std::default_delete<MappingTable>>::
  unique_ptr<std::default_delete<MappingTable>,void>(in_stack_fffffffffffffe80);
  in_RDI[0x58] = 100;
  in_RDI[0x59] = 0;
  in_RDI[0x5a] = 0;
  in_RDI[0x5b] = 0;
  PointerTable::PointerTable((PointerTable *)(in_RDI + 0x60),local_18);
  in_RDI[0xb8] = 0;
  in_RDI[0xb9] = 0;
  in_RDI[0xba] = 0;
  in_RDI[0xbb] = 0;
  in_RDI[0xbc] = 0;
  in_RDI[0xbd] = 0;
  in_RDI[0xbe] = 0;
  in_RDI[0xbf] = 0;
  in_RDI[0xc0] = 0;
  in_RDI[0xc1] = 0;
  in_RDI[0xc2] = 0;
  in_RDI[0xc3] = 0;
  in_RDI[0xc4] = 0;
  in_RDI[0xc5] = 0;
  in_RDI[0xc6] = 0;
  in_RDI[199] = 0;
  in_RDI[200] = 0;
  in_RDI[0xc9] = 0x40;
  in_RDI[0xca] = 0;
  in_RDI[0xcb] = 0;
  in_RDI[0xcc] = 0;
  in_RDI[0xcd] = 0;
  in_RDI[0xce] = 0;
  in_RDI[0xcf] = 0;
  in_RDI[0xd8] = 0;
  in_RDI[0xd9] = 0;
  in_RDI[0xda] = 0;
  in_RDI[0xdb] = 0;
  in_RDI[0xdc] = 0;
  in_RDI[0xdd] = 0;
  in_RDI[0xde] = 0;
  in_RDI[0xdf] = 0;
  in_RDI[0xe0] = 0;
  in_RDI[0xe1] = 0;
  in_RDI[0xe2] = 0;
  in_RDI[0xe3] = 0;
  in_RDI[0xe4] = 0;
  in_RDI[0xe5] = 0;
  in_RDI[0xe6] = 0;
  in_RDI[0xe7] = 0;
  in_RDI[0xe8] = 0;
  in_RDI[0xe9] = 0;
  in_RDI[0xea] = 0;
  in_RDI[0xeb] = 0;
  in_RDI[0xec] = 0;
  in_RDI[0xed] = 0;
  in_RDI[0xee] = 0;
  in_RDI[0xef] = 0;
  uVar1 = *(ulong *)(in_RDI + 200);
  sVar4 = Node<Tiles>::get_size_in_bytes();
  *(ulong *)(in_RDI + 0xd0) = uVar1 / sVar4;
  if ((local_a & 1) == 0) {
    std::
    vector<std::unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>,_std::allocator<std::unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>_>_>
    ::resize(in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
  }
  else {
    memory::make_unique<MappingTable,unsigned_long&>(in_stack_fffffffffffffe98);
    std::unique_ptr<MappingTable,_std::default_delete<MappingTable>_>::operator=
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    std::unique_ptr<MappingTable,_std::default_delete<MappingTable>_>::~unique_ptr
              (in_stack_fffffffffffffe80);
    std::
    vector<std::unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>,_std::allocator<std::unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>_>_>
    ::resize(in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
  }
  lVar5 = PointerTable::get_max_entries();
  sVar4 = Node<Tiles>::get_size_in_bytes();
  *(size_t *)(in_RDI + 0xc0) = lVar5 * sVar4;
  dfpair(_stdout,"external closed (bytes)","%lu",*(undefined8 *)(in_RDI + 0xc0));
  iVar2 = open("closed_list.bucket",0x242,0x180);
  *(int *)(in_RDI + 0xa8) = iVar2;
  if (*(int *)(in_RDI + 0xa8) < 0) {
    local_52 = 1;
    this_00 = (IOException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"Fail to create closed list file",&local_51);
    IOException::IOException
              (this_00,(string *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    local_52 = 0;
    __cxa_throw(this_00,&IOException::typeinfo,IOException::~IOException);
  }
  iVar2 = posix_fallocate64(*(int *)(in_RDI + 0xa8),0,*(__off64_t *)(in_RDI + 0xc0));
  if (iVar2 < 0) {
    local_7a = 1;
    uVar6 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Fail to fallocate closed list file",&local_79);
    IOException::IOException
              (in_stack_fffffffffffffec0,(string *)CONCAT44(iVar2,in_stack_fffffffffffffeb8));
    local_7a = 0;
    __cxa_throw(uVar6,&IOException::typeinfo,IOException::~IOException);
  }
  pvVar7 = mmap((void *)0x0,*(size_t *)(in_RDI + 0xc0),3,1,*(int *)(in_RDI + 0xa8),0);
  *(void **)(in_RDI + 0xb0) = pvVar7;
  if (*(long *)(in_RDI + 0xb0) == -1) {
    local_a2 = 1;
    uVar6 = __cxa_allocate_exception(0x10);
    paVar9 = &local_a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"Fail to mmap closed list file",paVar9);
    IOException::IOException
              (in_stack_fffffffffffffec0,(string *)CONCAT44(iVar2,in_stack_fffffffffffffeb8));
    local_a2 = 0;
    __cxa_throw(uVar6,&IOException::typeinfo,IOException::~IOException);
  }
  iVar3 = madvise(*(void **)(in_RDI + 0xb0),*(size_t *)(in_RDI + 0xc0),1);
  if (iVar3 < 0) {
    uVar6 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Fail to give madvise for closed list file",&local_c9);
    IOException::IOException
              (in_stack_fffffffffffffec0,(string *)CONCAT44(iVar2,in_stack_fffffffffffffeb8));
    __cxa_throw(uVar6,&IOException::typeinfo,IOException::~IOException);
  }
  if ((local_a & 1) != 0) {
    dfpair(_stdout,"number of partitions","%u",(ulong)*(uint *)(in_RDI + 0x58));
  }
  if ((local_b & 1) == 0) {
    dfpair(_stdout,"probe strategy","%s","linear probing");
  }
  else {
    dfpair(_stdout,"probe strategy","%s","double hashing");
  }
  p_Var8 = _stdout;
  uVar6 = PointerTable::get_max_entries();
  dfpair(p_Var8,"max capacity of closed list (nodes)","%lu",uVar6);
  return;
}

Assistant:

CompressClosedList<Entry>::CompressClosedList(bool reopen_closed,
                                                  bool enable_partitioning,
                                                  bool double_hashing,
                                                  size_t internal_closed_bytes)
        : reopen_closed(reopen_closed),
          enable_partitioning(enable_partitioning),
          double_hashing(double_hashing),
          internal_closed(internal_closed_bytes) 
    {
        max_buffer_entries = max_buffer_size_in_bytes / Entry::get_size_in_bytes();
        
        // initialize partition table
        if (enable_partitioning) {
            partition_table =
                memory::make_unique<MappingTable>(max_buffer_entries);
           
            buffers.resize(n_partitions);
        } else {
            buffers.resize(1); // use only buffers[0] if no partitioning
        }
        
        // initialize external closed list
        external_closed_bytes =
            internal_closed.get_max_entries() * Entry::get_size_in_bytes();
        dfpair(stdout, "external closed (bytes)", "%lu", external_closed_bytes);

        external_closed_fd = open("closed_list.bucket", O_CREAT | O_TRUNC | O_RDWR,
                                  S_IRUSR | S_IWUSR);
        if (external_closed_fd < 0)
            throw IOException("Fail to create closed list file");
        
        if (posix_fallocate64(external_closed_fd, 0, external_closed_bytes) < 0)
            throw IOException("Fail to fallocate closed list file");
        
        external_closed =
            static_cast<char *>(mmap(NULL, external_closed_bytes,
                                     PROT_READ | PROT_WRITE, MAP_SHARED,
                                     external_closed_fd, 0));
        if (external_closed == MAP_FAILED)
            throw IOException("Fail to mmap closed list file");

        if (madvise(external_closed, external_closed_bytes, MADV_RANDOM) < 0)
            throw IOException("Fail to give madvise for closed list file");

        // Logging
        if (enable_partitioning)
            dfpair(stdout, "number of partitions", "%u", n_partitions);
        if (double_hashing) {
            dfpair(stdout, "probe strategy", "%s", "double hashing");
        } else {
            dfpair(stdout, "probe strategy", "%s", "linear probing");
        }
        dfpair(stdout, "max capacity of closed list (nodes)", "%lu",
               internal_closed.get_max_entries());
    }